

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int get_this_mv(int_mv *this_mv,PREDICTION_MODE this_mode,int ref_idx,int ref_mv_idx,
               int skip_repeated_ref_mv,MV_REFERENCE_FRAME *ref_frame,MB_MODE_INFO_EXT *mbmi_ext)

{
  PREDICTION_MODE single_mode_00;
  byte bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  undefined1 in_SIL;
  undefined4 *in_RDI;
  int in_R8D;
  MV_REFERENCE_FRAME *in_R9;
  int ref_mv_offset;
  uint8_t ref_frame_type;
  PREDICTION_MODE single_mode;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  PREDICTION_MODE in_stack_ffffffffffffffd7;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  single_mode_00 = get_single_mode(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0);
  if (single_mode_00 == '\x10') {
    *in_RDI = 0x80008000;
  }
  else if (single_mode_00 == '\x0f') {
    if ((in_R8D != 0) &&
       (iVar2 = check_repeat_ref_mv((MB_MODE_INFO_EXT *)CONCAT44(uVar3,in_EDX),in_ECX,in_R9,'\x0f'),
       iVar2 != 0)) {
      return 0;
    }
    *in_RDI = *(undefined4 *)(_ref_mv_offset + 0x4a8 + (long)in_R9[in_EDX] * 4);
  }
  else {
    bVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (single_mode_00 == '\r') {
      iVar2 = 0;
    }
    else {
      iVar2 = in_ECX + 1;
    }
    if (iVar2 < (int)(uint)*(byte *)(_ref_mv_offset + 0x488 + (ulong)bVar1)) {
      if (in_EDX == 0) {
        *in_RDI = *(undefined4 *)(_ref_mv_offset + (ulong)bVar1 * 0x20 + (long)iVar2 * 8);
      }
      else {
        *in_RDI = *(undefined4 *)(_ref_mv_offset + (ulong)bVar1 * 0x20 + 4 + (long)iVar2 * 8);
      }
    }
    else {
      if ((in_R8D != 0) &&
         (iVar2 = check_repeat_ref_mv((MB_MODE_INFO_EXT *)CONCAT44(uVar3,in_EDX),in_ECX,in_R9,
                                      single_mode_00), iVar2 != 0)) {
        return 0;
      }
      *in_RDI = *(undefined4 *)(_ref_mv_offset + 0x4a8 + (long)in_R9[in_EDX] * 4);
    }
  }
  return 1;
}

Assistant:

static inline int get_this_mv(int_mv *this_mv, PREDICTION_MODE this_mode,
                              int ref_idx, int ref_mv_idx,
                              int skip_repeated_ref_mv,
                              const MV_REFERENCE_FRAME *ref_frame,
                              const MB_MODE_INFO_EXT *mbmi_ext) {
  const PREDICTION_MODE single_mode = get_single_mode(this_mode, ref_idx);
  assert(is_inter_singleref_mode(single_mode));
  if (single_mode == NEWMV) {
    this_mv->as_int = INVALID_MV;
  } else if (single_mode == GLOBALMV) {
    if (skip_repeated_ref_mv &&
        check_repeat_ref_mv(mbmi_ext, ref_idx, ref_frame, single_mode))
      return 0;
    *this_mv = mbmi_ext->global_mvs[ref_frame[ref_idx]];
  } else {
    assert(single_mode == NEARMV || single_mode == NEARESTMV);
    const uint8_t ref_frame_type = av1_ref_frame_type(ref_frame);
    const int ref_mv_offset = single_mode == NEARESTMV ? 0 : ref_mv_idx + 1;
    if (ref_mv_offset < mbmi_ext->ref_mv_count[ref_frame_type]) {
      assert(ref_mv_offset >= 0);
      if (ref_idx == 0) {
        *this_mv =
            mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_offset].this_mv;
      } else {
        *this_mv =
            mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_offset].comp_mv;
      }
    } else {
      if (skip_repeated_ref_mv &&
          check_repeat_ref_mv(mbmi_ext, ref_idx, ref_frame, single_mode))
        return 0;
      *this_mv = mbmi_ext->global_mvs[ref_frame[ref_idx]];
    }
  }
  return 1;
}